

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

interresult __thiscall
tetgenmesh::sscoutsegment
          (tetgenmesh *this,face *searchsh,point endpt,int insertsegflag,int reporterrorflag,
          int chkencflag)

{
  tetgenmesh *p1;
  shellface ppdVar1;
  tetgenmesh *pa;
  shellface *pppdVar2;
  shellface pb;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int iVar6;
  shellface *pppdVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  tetgenmesh *this_00;
  face *flipfaces;
  double dVar13;
  double dVar14;
  double dVar15;
  face flipshs [2];
  face newseg;
  undefined8 local_68;
  double tq;
  double tp;
  double Q [3];
  shellface ppdVar12;
  
  do {
    flipshs[0].sh = (shellface *)0x0;
    flipshs[1].sh = (shellface *)0x0;
    flipshs[1].shver = 0;
    p1 = (tetgenmesh *)searchsh->sh[sorgpivot[searchsh->shver]];
    if (2 < this->b->verbose) {
      printf("      Scout segment (%d, %d).\n",
             (ulong)*(uint *)((long)&p1->in + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
    }
    this_00 = this;
    dVar13 = distance(this,(double *)p1,endpt);
    pppdVar7 = searchsh->sh;
    uVar9 = searchsh->shver;
    bVar4 = false;
LAB_00129165:
    ppdVar1 = pppdVar7[sdestpivot[(int)uVar9]];
    if (ppdVar1 == (shellface)endpt) {
LAB_00129470:
      if (insertsegflag == 0) {
        return SHAREEDGE;
      }
      newseg.sh = (shellface *)0x0;
      newseg.shver = 0;
      makeshellface(this,this->subsegs,&newseg);
      uVar8 = (ulong)newseg.shver;
      newseg.sh[sorgpivot[uVar8]] = (shellface)p1;
      newseg.sh[sdestpivot[uVar8]] = (shellface)endpt;
      newseg.sh[sapexpivot[uVar8]] = (shellface)0x0;
      *(undefined4 *)((long)newseg.sh + (long)this->shmarkindex * 4) = 0xffffffff;
      iVar6 = searchsh->shver;
      lVar11 = (long)(iVar6 >> 1);
      searchsh->sh[lVar11 + 6] = (shellface)(uVar8 | (ulong)newseg.sh);
      *newseg.sh = (shellface)((long)iVar6 | (ulong)searchsh->sh);
      ppdVar1 = searchsh->sh[lVar11];
      if (((ulong)ppdVar1 & 0xfffffffffffffff8) != 0) {
        *(shellface *)
         (((ulong)ppdVar1 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar1 & 6) * 4) =
             (shellface)(uVar8 | (ulong)newseg.sh);
        *newseg.sh = ppdVar1;
        return SHAREEDGE;
      }
      return SHAREEDGE;
    }
    pa = (tetgenmesh *)pppdVar7[sapexpivot[(int)uVar9]];
    if (pa == (tetgenmesh *)endpt) {
      searchsh->shver = snextpivot[snextpivot[(int)uVar9]] ^ 1;
      goto LAB_00129470;
    }
    dVar14 = triarea(this_00,(double *)p1,(double *)ppdVar1,endpt);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar15 = 0.0;
    if (this->b->epsilon <= dVar14 / dVar13) {
      this_00 = p1;
      dVar15 = orient3d((double *)p1,(double *)ppdVar1,this->dummypoint,endpt);
    }
    dVar14 = triarea(this_00,(double *)pa,(double *)p1,endpt);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    if (dVar14 / dVar13 < this->b->epsilon) {
      if (0.0 <= dVar15) {
        if (0.0 < dVar15) goto LAB_00129640;
LAB_001292dd:
        this_00 = this;
        terminatetetgen(this,2);
        bVar5 = bVar4;
        if (bVar4) goto LAB_001292ed;
      }
LAB_00129347:
      pppdVar2 = searchsh->sh;
      lVar11 = (long)(searchsh->shver >> 1);
      if ((chkencflag != 0) && (pppdVar2[lVar11 + 6] != (shellface)0x0)) {
        return ACROSSEDGE;
      }
      pppdVar7 = (shellface *)((ulong)pppdVar2[lVar11] & 0xfffffffffffffff8);
      if (pppdVar7 == (shellface *)0x0) {
        iVar6 = snextpivot[snextpivot[searchsh->shver]];
        if ((chkencflag != 0) && (pppdVar2[(long)(iVar6 >> 1) + 6] != (shellface)0x0)) {
LAB_00129526:
          searchsh->shver = iVar6;
          return ACROSSEDGE;
        }
        uVar9 = (uint)pppdVar2[iVar6 >> 1] & 7;
        pppdVar7 = (shellface *)((ulong)pppdVar2[iVar6 >> 1] & 0xfffffffffffffff8);
        uVar9 = (tetgenmesh *)pppdVar7[sdestpivot[uVar9]] != pa ^ uVar9;
        searchsh->sh = pppdVar7;
      }
      else {
        uVar9 = (uint)pppdVar2[lVar11] & 7;
        ppdVar12 = pppdVar7[sorgpivot[uVar9]];
        searchsh->sh = pppdVar7;
        uVar9 = snextpivot[ppdVar12 != ppdVar1 ^ uVar9];
      }
      bVar4 = false;
LAB_0012944f:
      searchsh->shver = uVar9;
      goto LAB_00129165;
    }
    this_00 = pa;
    dVar14 = orient3d((double *)pa,(double *)p1,this->dummypoint,endpt);
    if (dVar15 < 0.0) {
      if (dVar14 < 0.0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = this->randomseed * 0x556 + 0x24d69;
        this->randomseed = SUB168(auVar3 % ZEXT816(0xae529),0);
        bVar5 = true;
        if ((auVar3 % ZEXT816(0xae529) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_001292ed;
      }
      goto LAB_00129347;
    }
    bVar5 = true;
    if (dVar14 < 0.0) {
LAB_001292ed:
      iVar6 = snextpivot[snextpivot[searchsh->shver]];
      pppdVar2 = searchsh->sh;
      lVar11 = (long)(iVar6 >> 1);
      iVar10 = searchsh->shver >> 1;
      bVar4 = bVar5;
      if (chkencflag == 0) {
        ppdVar12 = pppdVar2[lVar11];
        pppdVar7 = (shellface *)((ulong)ppdVar12 & 0xfffffffffffffff8);
        if (pppdVar7 != (shellface *)0x0) goto LAB_001293fb;
LAB_0012941e:
        uVar9 = (uint)pppdVar2[iVar10] & 7;
        pppdVar7 = (shellface *)((ulong)pppdVar2[iVar10] & 0xfffffffffffffff8);
        this_00 = (tetgenmesh *)(ulong)(pppdVar7[sorgpivot[uVar9]] != ppdVar1 ^ uVar9);
        searchsh->sh = pppdVar7;
        uVar9 = snextpivot[(long)this_00];
      }
      else {
        if (pppdVar2[lVar11 + 6] != (shellface)0x0) goto LAB_00129526;
        ppdVar12 = pppdVar2[lVar11];
        pppdVar7 = (shellface *)((ulong)ppdVar12 & 0xfffffffffffffff8);
        if (pppdVar7 == (shellface *)0x0) {
          if (pppdVar2[(long)iVar10 + 6] != (shellface)0x0) {
            return ACROSSEDGE;
          }
          goto LAB_0012941e;
        }
LAB_001293fb:
        uVar9 = (uint)ppdVar12 & 7;
        this_00 = (tetgenmesh *)(ulong)uVar9;
        uVar9 = (tetgenmesh *)pppdVar7[sdestpivot[(long)this_00]] != pa ^ uVar9;
        searchsh->sh = pppdVar7;
      }
      goto LAB_0012944f;
    }
    if (dVar15 <= 0.0) {
      if (dVar14 <= 0.0) goto LAB_001292dd;
      goto LAB_00129659;
    }
    if (dVar14 <= 0.0) {
LAB_00129640:
      searchsh->shver = snextpivot[snextpivot[searchsh->shver]] ^ 1;
LAB_00129659:
      if (reporterrorflag != 0) {
        ppdVar1 = searchsh->sh[sdestpivot[searchsh->shver]];
        printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
               (ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4));
        printf("  Vertex:  [%d] (%g,%g,%g).\n",*ppdVar1,ppdVar1[1],ppdVar1[2],
               (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4));
        printf("  Segment: [%d, %d]\n",
               (ulong)*(uint *)((long)&p1->in + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
        return ACROSSVERT;
      }
      return ACROSSVERT;
    }
    flipshs[0].sh = searchsh->sh;
    flipshs[0].shver = snextpivot[searchsh->shver];
    if (flipshs[0].sh[(long)(flipshs[0].shver >> 1) + 6] != (shellface)0x0) {
      if (reporterrorflag != 0) {
        tp = 0.0;
        tq = 0.0;
        linelineint(this,(double *)p1,endpt,(double *)ppdVar1,(double *)pa,(double *)&newseg,Q,&tp,
                    &tq);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),",newseg.sh,
               CONCAT44(newseg._12_4_,newseg.shver),local_68);
        printf(" in facet #%d.\n",(ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4)
              );
        printf("  Segment 1: [%d, %d]\n",
               (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4));
        printf("  Segment 2: [%d, %d]\n",
               (ulong)*(uint *)((long)&p1->in + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
      }
      return ACROSSEDGE;
    }
    flipshs[1].shver = (uint)flipshs[0].sh[flipshs[0].shver >> 1] & 7;
    flipshs[1].sh = (shellface *)((ulong)flipshs[0].sh[flipshs[0].shver >> 1] & 0xfffffffffffffff8);
    if (flipshs[1].sh[sorgpivot[(uint)flipshs[1].shver]] !=
        flipshs[0].sh[sdestpivot[flipshs[0].shver]]) {
      flipshs[1].shver = flipshs[1].shver ^ 1;
    }
    flipfaces = flipshs;
    flip22(this,flipfaces,1,0);
    iVar6 = flipshs[0].shver;
    pppdVar7 = flipshs[0].sh;
    ppdVar1 = flipshs[1].sh[sapexpivot[flipshs[1].shver]];
    lVar11 = (long)flipshs[0].shver;
    ppdVar12 = flipshs[0].sh[sorgpivot[lVar11]];
    pb = flipshs[0].sh[sdestpivot[lVar11]];
    dVar13 = orient3d((double *)ppdVar12,(double *)pb,this->dummypoint,
                      (double *)flipshs[0].sh[sapexpivot[lVar11]]);
    dVar14 = orient3d((double *)pb,(double *)ppdVar12,this->dummypoint,(double *)ppdVar1);
    if ((dVar13 <= 0.0) || (flipfaces = flipshs + 1, dVar14 <= 0.0)) {
      flipshpush(this,flipfaces);
    }
    searchsh->sh = pppdVar7;
    searchsh->shver = iVar6;
  } while( true );
}

Assistant:

enum tetgenmesh::interresult tetgenmesh::sscoutsegment(face *searchsh, 
  point endpt, int insertsegflag, int reporterrorflag, int chkencflag)
{
  face flipshs[2], neighsh;
  point startpt, pa, pb, pc, pd;
  enum interresult dir;
  enum {MOVE_AB, MOVE_CA} nextmove;
  REAL ori_ab, ori_ca, len;

  // The origin of 'searchsh' is fixed.
  startpt = sorg(*searchsh); 
  nextmove = MOVE_AB; // Avoid compiler warning.

  if (b->verbose > 2) {
    printf("      Scout segment (%d, %d).\n", pointmark(startpt),
           pointmark(endpt));
  }
  len = distance(startpt, endpt);

  // Search an edge in 'searchsh' on the path of this segment.
  while (1) {

    pb = sdest(*searchsh);
    if (pb == endpt) {
      dir = SHAREEDGE; // Found!
      break;
    }

    pc = sapex(*searchsh);
    if (pc == endpt) {
      senext2self(*searchsh);
      sesymself(*searchsh);
      dir = SHAREEDGE; // Found!
      break;
    }


    // Round the results.
    if ((sqrt(triarea(startpt, pb, endpt)) / len) < b->epsilon) {
      ori_ab = 0.0;
    } else {
      ori_ab = orient3d(startpt, pb, dummypoint, endpt);
    }
    if ((sqrt(triarea(pc, startpt, endpt)) / len) < b->epsilon) {
      ori_ca = 0.0;
    } else {
      ori_ca = orient3d(pc, startpt, dummypoint, endpt);
    }

    if (ori_ab < 0) {
      if (ori_ca < 0) { // (--)
        // Both sides are viable moves.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_AB;
        }
      } else { // (-#)
        nextmove = MOVE_AB;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        nextmove = MOVE_CA;
      } else {
        if (ori_ab > 0) {
          if (ori_ca > 0) { // (++)
            // The segment intersects with edge [b, c].
            dir = ACROSSEDGE;
            break;
          } else { // (+0)
            // The segment collinear with edge [c, a].
            senext2self(*searchsh);
            sesymself(*searchsh); 
            dir = ACROSSVERT;
            break;
          }
        } else {
          if (ori_ca > 0) { // (0+)
            // The segment is collinear with edge [a, b].
            dir = ACROSSVERT;
            break;
          } else { // (00)
            // startpt == endpt. Not possible.
            terminatetetgen(this, 2);
          }
        }
      }
    }

    // Move 'searchsh' to the next face, keep the origin unchanged.
    if (nextmove == MOVE_AB) {
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(*searchsh)) {
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      } else {
        // This side (startpt->pb) is outside. It is caused by rounding error.
        // Try the next side, i.e., (pc->startpt).
        senext2(*searchsh, neighsh);
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(neighsh)) {
            *searchsh = neighsh;
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivotself(neighsh);
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      }
    } else { // MOVE_CA
      senext2(*searchsh, neighsh);
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(neighsh)) {
          *searchsh = neighsh;
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivotself(neighsh);
      if (neighsh.sh != NULL) {
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      } else {
        // The same reason as above. 
        // Try the next side, i.e., (startpt->pb).
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(*searchsh)) {
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivot(*searchsh, neighsh);
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      }
    }
  } // while

  if (dir == SHAREEDGE) {
    if (insertsegflag) {
      // Insert the segment into the triangulation.
      face newseg;
      makeshellface(subsegs, &newseg);
      setshvertices(newseg, startpt, endpt, NULL);
      // Set the default segment marker.
      setshellmark(newseg, -1);
      ssbond(*searchsh, newseg);
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        ssbond(neighsh, newseg);
      }
    }
    return dir;
  }

  if (dir == ACROSSVERT) {
    // A point is found collinear with this segment.
    if (reporterrorflag) {
      point pp = sdest(*searchsh);
      printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
             shellmark(*searchsh));
      printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
      printf("  Segment: [%d, %d]\n", pointmark(startpt), pointmark(endpt));
    }
    return dir;
  }

  if (dir == ACROSSEDGE) {
    // Edge [b, c] intersects with the segment.
    senext(*searchsh, flipshs[0]);
    if (isshsubseg(flipshs[0])) {
      if (reporterrorflag) {
        REAL P[3], Q[3], tp = 0, tq = 0;
        linelineint(startpt, endpt, pb, pc, P, Q, &tp, &tq);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),", 
               P[0], P[1], P[2]);
        printf(" in facet #%d.\n", shellmark(*searchsh));
        printf("  Segment 1: [%d, %d]\n", pointmark(pb), pointmark(pc));
        printf("  Segment 2: [%d, %d]\n", pointmark(startpt),pointmark(endpt));
      }
      return dir; // ACROSS_SEG
    }
    // Flip edge [b, c], queue unflipped edges (for Delaunay checks).
    spivot(flipshs[0], flipshs[1]);
    if (sorg(flipshs[1]) != sdest(flipshs[0])) sesymself(flipshs[1]);
    flip22(flipshs, 1, 0);
    // The flip may create an inverted triangle, check it.
    pa = sapex(flipshs[1]);
    pb = sapex(flipshs[0]);
    pc = sorg(flipshs[0]);
    pd = sdest(flipshs[0]);
    // Check if pa and pb are on the different sides of [pc, pd]. 
    // Re-use ori_ab, ori_ca for the tests.
    ori_ab = orient3d(pc, pd, dummypoint, pb);
    ori_ca = orient3d(pd, pc, dummypoint, pa);
    if (ori_ab <= 0) {
      flipshpush(&(flipshs[0])); 
    } else if (ori_ca <= 0) {
      flipshpush(&(flipshs[1])); 
    }
    // Set 'searchsh' s.t. its origin is 'startpt'.
    *searchsh = flipshs[0];
  }

  return sscoutsegment(searchsh, endpt, insertsegflag, reporterrorflag, 
                       chkencflag);
}